

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<int_(int)>::Action(Action<int_(int)> *this,ActionInterface<int_(int)> *impl)

{
  ActionAdapter local_28;
  ActionInterface<int_(int)> *local_18;
  ActionInterface<int_(int)> *impl_local;
  Action<int_(int)> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<int_(int)> *)this;
  std::shared_ptr<testing::ActionInterface<int(int)>>::
  shared_ptr<testing::ActionInterface<int(int)>,void>
            ((shared_ptr<testing::ActionInterface<int(int)>> *)&local_28,impl);
  std::function<int(int)>::function<testing::Action<int(int)>::ActionAdapter,void>
            ((function<int(int)> *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}